

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O2

void __thiscall TypeOpCallother::printRaw(TypeOpCallother *this,ostream *s,PcodeOp *op)

{
  int4 i;
  long lVar1;
  string asStack_48 [32];
  
  if (op->output != (Varnode *)0x0) {
    Varnode::printRaw(op->output,s);
    std::operator<<(s," = ");
  }
  (*(this->super_TypeOp)._vptr_TypeOp[0xb])(asStack_48,this,op);
  std::operator<<(s,asStack_48);
  std::__cxx11::string::~string(asStack_48);
  if (1 < (int)((ulong)((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    std::operator<<(s,'(');
    Varnode::printRaw((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_start[1],s);
    for (lVar1 = 2;
        lVar1 < (int)((ulong)((long)(op->inrefs).
                                    super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(op->inrefs).
                                   super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                                   .super__Vector_impl_data._M_start) >> 3); lVar1 = lVar1 + 1) {
      std::operator<<(s,',');
      Varnode::printRaw((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar1],s);
    }
    std::operator<<(s,')');
  }
  return;
}

Assistant:

void TypeOpCallother::printRaw(ostream &s,const PcodeOp *op)

{
  if (op->getOut() != (Varnode *)0) {
    op->getOut()->printRaw(s);
    s << " = ";
  }
  s << getOperatorName(op);
  if (op->numInput()>1) {
    s << '(';
    op->getIn(1)->printRaw(s);
    for(int4 i=2;i<op->numInput();++i) {
      s << ',';
      op->getIn(i)->printRaw(s);
    }
    s << ')';
  }
}